

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O0

void __thiscall CTcParser::parse_enum(CTcParser *this,int *err)

{
  bool bVar1;
  bool bVar2;
  tc_toktyp_t tVar3;
  int iVar4;
  tc_symtype_t tVar5;
  CTcToken *pCVar6;
  CTcSymEnumBase *this_00;
  CTcSymEnum *this_01;
  char *str;
  CTcParser *in_RDI;
  CTcSymEnum *sym;
  int is_token;
  int done;
  textchar_t *in_stack_ffffffffffffff78;
  CTcTokenizer *in_stack_ffffffffffffff80;
  CTcTokenizer *in_stack_ffffffffffffff88;
  CTcTokenizer *in_stack_ffffffffffffff90;
  
  bVar2 = false;
  CTcTokenizer::next(in_stack_ffffffffffffff88);
  tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x219247);
  if ((tVar3 == TOKT_SYM) &&
     (iVar4 = CTcTokenizer::cur_tok_matches
                        (in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
                         (size_t)in_stack_ffffffffffffff80), iVar4 != 0)) {
    bVar2 = true;
    CTcTokenizer::next(in_stack_ffffffffffffff88);
  }
  bVar1 = false;
  while (!bVar1) {
    tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x2192ad);
    iVar4 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    switch(tVar3) {
    case TOKT_EOF:
    case TOKT_LBRACE:
    case TOKT_RBRACE:
      CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff80,iVar4);
      bVar1 = true;
      break;
    default:
      CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff80,iVar4);
      CTcTokenizer::next(in_stack_ffffffffffffff88);
      break;
    case TOKT_SYM:
      pCVar6 = CTcTokenizer::getcur(G_tok);
      CTcToken::get_text(pCVar6);
      pCVar6 = CTcTokenizer::getcur(G_tok);
      CTcToken::get_text_len(pCVar6);
      this_00 = (CTcSymEnumBase *)
                CTcPrsSymtab::find((CTcPrsSymtab *)in_stack_ffffffffffffff80,
                                   in_stack_ffffffffffffff78,0x21932b);
      iVar4 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      if (this_00 == (CTcSymEnumBase *)0x0) {
        this_01 = (CTcSymEnum *)CTcSymbolBase::operator_new(0x219384);
        pCVar6 = CTcTokenizer::getcur(G_tok);
        str = CTcToken::get_text(pCVar6);
        pCVar6 = CTcTokenizer::getcur(G_tok);
        in_stack_ffffffffffffff88 = (CTcTokenizer *)CTcToken::get_text_len(pCVar6);
        in_stack_ffffffffffffff80 = (CTcTokenizer *)new_enum_id(in_RDI);
        CTcSymEnum::CTcSymEnum
                  (this_01,str,(size_t)pCVar6,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                   (ulong)in_stack_ffffffffffffff80,iVar4);
        (*in_RDI->global_symtab_->_vptr_CTcPrsSymtab[3])(in_RDI->global_symtab_,this_01);
        (*(this_01->super_CTcSymEnumBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
          super_CVmHashEntry._vptr_CVmHashEntry[0xf])();
      }
      else {
        tVar5 = CTcSymbolBase::get_type((CTcSymbolBase *)this_00);
        if (tVar5 == TC_SYM_ENUM) {
          if (bVar2) {
            CTcSymEnumBase::set_is_token(this_00,1);
          }
        }
        else {
          CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff80,iVar4);
        }
      }
      tVar3 = CTcTokenizer::next(in_stack_ffffffffffffff88);
      in_stack_ffffffffffffff78 = (textchar_t *)(ulong)(tVar3 - TOKT_EOF);
      switch(in_stack_ffffffffffffff78) {
      case (textchar_t *)0x0:
      case (textchar_t *)0x15:
      case (textchar_t *)0x16:
        CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff80,0);
        bVar1 = true;
        break;
      default:
        CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff80,0);
        CTcTokenizer::next(in_stack_ffffffffffffff88);
        break;
      case (textchar_t *)0x13:
        CTcTokenizer::next(in_stack_ffffffffffffff88);
        break;
      case (textchar_t *)0x28:
        bVar1 = true;
        CTcTokenizer::next(in_stack_ffffffffffffff88);
      }
      break;
    case TOKT_SEM:
      CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff80,iVar4);
      CTcTokenizer::next(in_stack_ffffffffffffff88);
      bVar1 = true;
    }
  }
  return;
}

Assistant:

void CTcParser::parse_enum(int *err)
{
    int done;
    int is_token;

    /* presume it's not a 'token' enum */
    is_token = FALSE;
    
    /* skip the 'enum' token */
    G_tok->next();

    /* 
     *   if this is the 'token' context-sensitive keyword, note it and
     *   skip it 
     */
    if (G_tok->cur() == TOKT_SYM && G_tok->cur_tok_matches("token", 5))
    {
        /* remember that it's a 'token' enum */
        is_token = TRUE;

        /* skip the keyword */
        G_tok->next();
    }

    /* parse enum constants */
    for (done = FALSE ; !done ; )
    {
        CTcSymEnum *sym;
        
        switch (G_tok->cur())
        {
        case TOKT_SYM:
            /* make sure the symbol isn't already defined */
            sym = (CTcSymEnum *)
                  global_symtab_->find(G_tok->getcur()->get_text(),
                                       G_tok->getcur()->get_text_len());

            /* if it's already defined, make sure it's an enum */
            if (sym != 0)
            {
                /* if it's not an enum, it's an error */
                if (sym->get_type() != TC_SYM_ENUM)
                {
                    /* log the error */
                    G_tok->log_error_curtok(TCERR_REDEF_AS_ENUM);
                }
                else if (is_token)
                {
                    /* 
                     *   we're defining a token - mark the old symbol as a
                     *   token if it wasn't already 
                     */
                    sym->set_is_token(TRUE);
                }
            }
            else
            {
                /* create the new symbol */
                sym = new CTcSymEnum(G_tok->getcur()->get_text(),
                                     G_tok->getcur()->get_text_len(),
                                     FALSE, new_enum_id(), is_token);

                /* add it to the symbol table */
                global_symtab_->add_entry(sym);

                /* mark it as referenced, since it's defined here */
                sym->mark_referenced();
            }

            /* skip the symbol name and see what follows */
            switch(G_tok->next())
            {
            case TOKT_COMMA:
                /* skip the comma and keep going */
                G_tok->next();
                break;
                
            case TOKT_SEM:
                /* end of the statement */
                done = TRUE;
                G_tok->next();
                break;

            case TOKT_LBRACE:
            case TOKT_RBRACE:
            case TOKT_EOF:
                /* they probably omitted the closing semicolon */
                G_tok->log_error_curtok(TCERR_EXPECTED_SEMI);
                done = TRUE;
                break;

            default:
                /* a comma was required */
                G_tok->log_error_curtok(TCERR_ENUM_REQ_COMMA);

                /* skip the offending symbol and proceed */
                G_tok->next();
                break;
            }

            /* done with this token */
            break;

        case TOKT_LBRACE:
        case TOKT_RBRACE:
        case TOKT_EOF:
            /* 
             *   they probably omitted the closing semicolon - log an
             *   error, then stop scanning the statement, since we're
             *   probably in the next statement already 
             */
            G_tok->log_error_curtok(TCERR_EXPECTED_SEMI);
            done = TRUE;
            break;

        case TOKT_SEM:
            /* they must have left out a symbol */
            G_tok->log_error_curtok(TCERR_ENUM_REQ_SYM);

            /* accept the semicolon as the end of the statement */
            G_tok->next();
            done = TRUE;
            break;
            
        default:
            /* anything else is an error */
            G_tok->log_error_curtok(TCERR_ENUM_REQ_SYM);

            /* skip the offending token and keep parsing */
            G_tok->next();
            break;
        }
    }
}